

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestFailureTest.cpp
# Opt level: O3

void __thiscall
TEST_TestFailure_EqualsFailureWithNullAsExpected_Test::testBody
          (TEST_TestFailure_EqualsFailureWithNullAsExpected_Test *this)

{
  UtestShell *pUVar1;
  char *pcVar2;
  TestTerminator *pTVar3;
  EqualsFailure f;
  undefined1 local_88 [120];
  
  pUVar1 = (this->super_TEST_GROUP_CppUTestGroupTestFailure).test;
  SimpleString::SimpleString((SimpleString *)local_88,"");
  EqualsFailure::EqualsFailure
            ((EqualsFailure *)(local_88 + 0x10),pUVar1,"fail.cpp",2,(char *)0x0,"actual",
             (SimpleString *)local_88);
  SimpleString::~SimpleString((SimpleString *)local_88);
  pUVar1 = UtestShell::getCurrent();
  TestFailure::getMessage((TestFailure *)local_88);
  pcVar2 = SimpleString::asCharString((SimpleString *)local_88);
  pTVar3 = UtestShell::getCurrentTestTerminator();
  (*pUVar1->_vptr_UtestShell[9])
            (pUVar1,"expected <(null)>\n\tbut was  <actual>",pcVar2,"",
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/TestFailureTest.cpp"
             ,0x58,pTVar3);
  SimpleString::~SimpleString((SimpleString *)local_88);
  TestFailure::~TestFailure((TestFailure *)(local_88 + 0x10));
  return;
}

Assistant:

TEST(TestFailure, EqualsFailureWithNullAsExpected)
{
    EqualsFailure f(test, failFileName, failLineNumber, NULLPTR, "actual", "");
    FAILURE_EQUAL("expected <(null)>\n\tbut was  <actual>", f);
}